

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

void __thiscall GrcManager::DetermineTableVersion(GrcManager *this)

{
  int fxdSilfVersion;
  bool bVar1;
  _Alloc_hider _Var2;
  bool fFixPassConstraints;
  int fxdVersionNeeded;
  int fxdCompilerVersionNeeded;
  bool local_185;
  int local_184;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  int local_f4;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_185 = true;
  fxdSilfVersion = this->m_fxdSilfTableVersion;
  SetCompilerVersionFor(this,fxdSilfVersion);
  local_f4 = this->m_fxdCompilerVersion;
  bVar1 = CompatibleWithVersion(this,fxdSilfVersion,&local_184,&local_f4,&local_185);
  if (bVar1) {
    if (local_184 <= fxdSilfVersion) {
      return;
    }
    goto LAB_00137524;
  }
  if (((fxdSilfVersion < 0x30001) && (local_185 != false)) && (0x30000 < local_184)) {
    if (this->m_fUserSpecifiedVersion != false) {
      GdlRenderer::MovePassConstraintsToRules(this->m_prndr,fxdSilfVersion);
      return;
    }
    local_180 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Version ","");
    VersionString_abi_cxx11_(&local_50,fxdSilfVersion);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,
               " of the Silf table is inadequate to handle pass constraints; version ","");
    VersionString_abi_cxx11_(&local_70,local_184);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," will be generated.","");
    GrcErrorList::AddItem
              (&g_errorList,false,0xdad,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_118,&local_50,
               &local_138,&local_70,&local_d0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_158.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
    _Var2._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_00137524;
  }
  else {
    if (this->m_fUserSpecifiedVersion == false) goto LAB_00137524;
    local_180 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Version ","");
    VersionString_abi_cxx11_(&local_90,fxdSilfVersion);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,
               " of the Silf table is inadequate for your specification; version ","");
    VersionString_abi_cxx11_(&local_b0,local_184);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0," will be generated instead.","");
    GrcErrorList::AddItem
              (&g_errorList,false,0xdad,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_158,&local_90,
               &local_178,&local_b0,&local_f0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_00137524;
  }
  operator_delete(_Var2._M_p,local_158.field_2._M_allocated_capacity + 1);
LAB_00137524:
  this->m_fxdSilfTableVersion = local_184;
  return;
}

Assistant:

void GrcManager::DetermineTableVersion()
{
	int fxdVersionNeeded;
	bool fFixPassConstraints = true;	// remains true if the only thing that is incompatible are
										// the pass constraints
	int fxdRequested = SilfTableVersion();
	SetCompilerVersionFor(fxdRequested);
	int fxdCompilerVersionNeeded = m_fxdCompilerVersion;
	if (!CompatibleWithVersion(fxdRequested, &fxdVersionNeeded, &fxdCompilerVersionNeeded,
			&fFixPassConstraints))
	{
		if (fFixPassConstraints && fxdRequested <= 0x00030000 && fxdVersionNeeded > 0x00030000)
		{
			if (UserSpecifiedVersion())
			{
				// Converting pass constraints to rule constraints should take care of the
				// incompatibility.
				m_prndr->MovePassConstraintsToRules(fxdRequested);
			}
			else
			{
				g_errorList.AddWarning(3501, NULL,
					"Version ",
					VersionString(fxdRequested),
					" of the Silf table is inadequate to handle pass constraints; version ",
					VersionString(fxdVersionNeeded),
					" will be generated.");
				FixSilfTableVersion(fxdVersionNeeded);
			}
		}
		else 
		{
			if (UserSpecifiedVersion())
			{
				g_errorList.AddWarning(3501, NULL,
					"Version ",
					VersionString(fxdRequested),
					" of the Silf table is inadequate for your specification; version ",
					VersionString(fxdVersionNeeded),
					" will be generated instead.");
			}
			FixSilfTableVersion(fxdVersionNeeded);
		}
		
	}
	else if (fxdVersionNeeded > fxdRequested)
	{
		// Eg, 2.0 -> 2.1
		FixSilfTableVersion(fxdVersionNeeded);
	}

}